

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmk.cpp
# Opt level: O3

bool ReadDMK(MemFile *file,shared_ptr<Disk> *disk)

{
  ushort uVar1;
  uchar *__src;
  Disk *this;
  element_type *peVar2;
  byte bVar3;
  undefined4 uVar4;
  char extraout_AL;
  bool bVar5;
  int iVar6;
  Encoding encoding;
  uint uVar7;
  ssize_t sVar8;
  string *psVar9;
  long lVar10;
  LogHelper *pLVar11;
  ulong uVar12;
  undefined7 uVar14;
  BitBuffer *__buf;
  mapped_type *pmVar13;
  exception *this_00;
  size_t in_RCX;
  int7 iVar15;
  OPTIONS *__n;
  int iVar16;
  int iVar17;
  char *pcVar18;
  int iVar19;
  uint uVar20;
  pointer unaff_R12;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  size_type __n_00;
  int pos;
  Encoding next_idam_encoding;
  value_type b;
  Encoding current_idam_encoding;
  int total_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  DMK_HEADER dh;
  BitstreamTrackBuilder bitbuf;
  uint local_148;
  Encoding local_144;
  int local_140;
  CylHead local_13c;
  uint local_134;
  uint local_130;
  Encoding local_12c;
  ulong local_128;
  ushort *local_120;
  uint local_118;
  int local_114;
  uint local_110;
  int local_10c;
  string local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  shared_ptr<Disk> *local_d8;
  uint local_d0;
  uint local_cc;
  undefined4 local_c8;
  uint local_c4;
  MemFile *local_c0;
  size_type local_b8;
  undefined1 local_b0 [32];
  pointer local_90;
  pointer local_80;
  pointer local_78;
  pointer local_68;
  pointer local_60;
  pointer local_50;
  
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = disk;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar8 = MemFile::read(file,(int)&local_e8,(void *)0x10,in_RCX), uVar22 = local_e8,
      (char)sVar8 == '\0')) || ((byte)((char)local_e8 - 1U) < 0xfe)) {
    return false;
  }
  if (uStack_e0._4_4_ == 0x12345678) {
    this_00 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[51]>
              (this_00,(char (*) [51])"DMK real-disk-specification images contain no data");
  }
  else {
    uVar12 = (ulong)local_e8._2_2_;
    if ((ushort)(local_e8._2_2_ + 0xc000) < 0xc001 || local_e8._1_1_ == 0) {
      return false;
    }
    bVar3 = local_e8._4_1_;
    local_d0 = local_e8._4_1_ & 0x10;
    uVar23 = (uint)local_e8._1_1_;
    local_10c = (local_e8._2_2_ * uVar23 << ((byte)(local_d0 >> 4) ^ 1)) + 0x10;
    iVar6 = MemFile::size(file);
    local_cc = uVar23;
    if (iVar6 != local_10c) {
      psVar9 = MemFile::name_abi_cxx11_(file);
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"dmk","");
      bVar5 = IsFileExt(psVar9,(string *)local_b0);
      if (bVar5) {
        bVar5 = false;
      }
      else {
        psVar9 = MemFile::name_abi_cxx11_(file);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"dsk","");
        bVar5 = IsFileExt(psVar9,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        bVar5 = !bVar5;
      }
      unaff_R12 = local_b0 + 0x10;
      if ((pointer)local_b0._0_8_ != unaff_R12) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      if (bVar5) {
        return false;
      }
      iVar6 = MemFile::size(file);
      local_b0._0_4_ = iVar6;
      Message<int,int&>(msgWarning,"DMK size (%d) doesn\'t match calculated size (%d)",
                        (int *)local_b0,&local_10c);
    }
    if (-1 < (char)bVar3) {
      __n_00 = uVar12 - 0x80;
      local_128 = 0;
      local_110 = ((uVar22 & 0x4000000000) == 0) + 1;
      __n = (OPTIONS *)((ulong)(bVar3 >> 6) ^ 1);
      local_c4 = 3 << (sbyte)__n;
      local_c0 = file;
      local_b8 = __n_00;
      do {
        unaff_R12 = (pointer)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
        local_140 = 0;
        do {
          local_120 = (ushort *)operator_new(0x80);
          local_120[0x38] = 0;
          local_120[0x39] = 0;
          local_120[0x3a] = 0;
          local_120[0x3b] = 0;
          local_120[0x3c] = 0;
          local_120[0x3d] = 0;
          local_120[0x3e] = 0;
          local_120[0x3f] = 0;
          local_120[0x30] = 0;
          local_120[0x31] = 0;
          local_120[0x32] = 0;
          local_120[0x33] = 0;
          local_120[0x34] = 0;
          local_120[0x35] = 0;
          local_120[0x36] = 0;
          local_120[0x37] = 0;
          local_120[0x28] = 0;
          local_120[0x29] = 0;
          local_120[0x2a] = 0;
          local_120[0x2b] = 0;
          local_120[0x2c] = 0;
          local_120[0x2d] = 0;
          local_120[0x2e] = 0;
          local_120[0x2f] = 0;
          local_120[0x20] = 0;
          local_120[0x21] = 0;
          local_120[0x22] = 0;
          local_120[0x23] = 0;
          local_120[0x24] = 0;
          local_120[0x25] = 0;
          local_120[0x26] = 0;
          local_120[0x27] = 0;
          local_120[0x18] = 0;
          local_120[0x19] = 0;
          local_120[0x1a] = 0;
          local_120[0x1b] = 0;
          local_120[0x1c] = 0;
          local_120[0x1d] = 0;
          local_120[0x1e] = 0;
          local_120[0x1f] = 0;
          local_120[0x10] = 0;
          local_120[0x11] = 0;
          local_120[0x12] = 0;
          local_120[0x13] = 0;
          local_120[0x14] = 0;
          local_120[0x15] = 0;
          local_120[0x16] = 0;
          local_120[0x17] = 0;
          local_120[8] = 0;
          local_120[9] = 0;
          local_120[10] = 0;
          local_120[0xb] = 0;
          local_120[0xc] = 0;
          local_120[0xd] = 0;
          local_120[0xe] = 0;
          local_120[0xf] = 0;
          local_120[0] = 0;
          local_120[1] = 0;
          local_120[2] = 0;
          local_120[3] = 0;
          local_120[4] = 0;
          local_120[5] = 0;
          local_120[6] = 0;
          local_120[7] = 0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,__n_00,
                     (allocator_type *)local_b0);
          iVar6 = MemFile::remaining(file);
          if (iVar6 < 0x80) {
LAB_0018a7fa:
            local_b0._0_8_ = CH((int)local_128,local_140);
            Message<char_const*>(msgWarning,"short file reading %s",(char **)local_b0);
          }
          else {
            __src = (file->m_it)._M_current;
            memcpy(local_120,__src,0x80);
            (file->m_it)._M_current = __src + 0x80;
            iVar17 = (int)local_108._M_string_length - (int)local_108._M_dataplus._M_p;
            iVar6 = MemFile::remaining(file);
            if (iVar6 < iVar17) goto LAB_0018a7fa;
            memcpy(local_108._M_dataplus._M_p,(file->m_it)._M_current,(long)iVar17);
            (file->m_it)._M_current = (file->m_it)._M_current + iVar17;
          }
          lVar10 = 0;
          do {
            lVar10 = lVar10 + 8;
          } while (lVar10 != 0x40);
          local_148 = 0;
          uVar1 = *local_120;
          uVar23 = local_110;
          if ((short)uVar1 < 1) {
            uVar23 = 1;
          }
          uVar22 = (ulong)uVar23;
          local_144 = (0 < (short)uVar1) + MFM;
          local_12c = local_144;
          BitstreamTrackBuilder::BitstreamTrackBuilder
                    ((BitstreamTrackBuilder *)local_b0,_250K,local_144);
          local_c8 = SUB84(unaff_R12,0);
          if (opt.debug != 0) {
            pLVar11 = util::operator<<((LogHelper *)&util::cout,(char (*) [6])"DMK: ");
            CylHead::CylHead(&local_13c,(int)local_128,local_140);
            pLVar11 = util::operator<<(pLVar11,&local_13c);
            util::operator<<(pLVar11,(char (*) [2])0x1ad40e);
          }
          uVar12 = (ulong)local_148;
          uVar20 = 0;
          uVar7 = local_148;
          if ((int)local_148 < (int)__n_00) {
            uVar21 = (uVar1 & 0x3fff) - 0x80;
            local_134 = 0;
            local_118 = 0;
            local_130 = 0;
            uVar20 = 0;
            local_114 = 0;
            do {
              iVar6 = (int)uVar12;
              local_13c.cyl._0_1_ = local_108._M_dataplus._M_p[iVar6];
              iVar15 = (int7)(int3)(uVar12 >> 8);
              __n = (OPTIONS *)CONCAT71(iVar15,(byte)local_13c.cyl);
              iVar17 = (int)uVar22;
              if (((int)uVar21 < 1) || (iVar6 < (int)uVar21)) {
                uVar14 = (undefined7)(uVar12 >> 8);
                if (((local_118 & 1) == 0) && (((byte)local_13c.cyl == 0xfc && (local_130 == 0)))) {
                  local_118 = (uint)CONCAT71(uVar14,1);
                  if (opt.debug != 0) {
                    pLVar11 = util::operator<<((LogHelper *)&util::cout,&local_144);
                    pLVar11 = util::operator<<(pLVar11,(char (*) [16])" IAM at offset ");
                    pLVar11 = util::operator<<(pLVar11,(int *)&local_148);
                    util::operator<<(pLVar11,(char (*) [2])0x1ad40e);
                  }
                  goto LAB_0018aa48;
                }
                bVar5 = (byte)((byte)local_13c.cyl + 2) < 0xfa;
                __n = (OPTIONS *)CONCAT71(iVar15,bVar5 | (byte)local_134);
                if (!bVar5 && (local_134 & 1) == 0) {
                  __n = (OPTIONS *)(ulong)local_12c;
                  iVar19 = 7;
                  if (local_12c == MFM) {
                    iVar19 = 0xe;
                  }
                  iVar16 = iVar6 - local_130;
                  if (local_130 == 0) {
                    iVar16 = 0;
                  }
                  if (iVar19 * iVar17 <= iVar16) {
                    iVar19 = 0x25;
                    if (local_12c == MFM) {
                      iVar19 = 0x39;
                    }
                    __n = (OPTIONS *)(ulong)(uint)(iVar19 * iVar17);
                    if (iVar16 <= iVar19 * iVar17) {
                      local_134 = (uint)CONCAT71(uVar14,1);
                      if (opt.debug != 0) {
                        pLVar11 = util::operator<<((LogHelper *)&util::cout,&local_12c);
                        pLVar11 = util::operator<<(pLVar11,(char (*) [7])" DAM (");
                        pLVar11 = util::operator<<(pLVar11,(uchar *)&local_13c);
                        pLVar11 = util::operator<<(pLVar11,(char (*) [13])") at offset ");
                        pLVar11 = util::operator<<(pLVar11,(int *)&local_148);
                        util::operator<<(pLVar11,(char (*) [2])0x1ad40e);
                      }
                      goto LAB_0018aa48;
                    }
                  }
                }
                local_148 = iVar6 + iVar17;
                uVar12 = (ulong)local_148;
              }
              else {
                local_13c.cyl._0_1_ = local_108._M_dataplus._M_p[uVar21];
                __n = &opt;
                local_148 = uVar21;
                if (opt.debug != 0) {
                  pLVar11 = util::operator<<((LogHelper *)&util::cout,&local_144);
                  pLVar11 = util::operator<<(pLVar11,(char (*) [8])" IDAM (");
                  uVar23 = local_c4;
                  if (local_144 == MFM) {
                    uVar23 = 3;
                  }
                  __n = (OPTIONS *)(long)(int)local_148;
                  pLVar11 = util::operator<<(pLVar11,(uchar *)(local_108._M_dataplus._M_p +
                                                              (long)&(__n->range).cyl_begin +
                                                              (ulong)uVar23));
                  pLVar11 = util::operator<<(pLVar11,(char (*) [13])") at offset ");
                  pLVar11 = util::operator<<(pLVar11,(int *)&local_148);
                  util::operator<<(pLVar11,(char (*) [2])0x1ad40e);
                }
                if ((byte)local_13c.cyl != 0xfe) {
                  __assert_fail("b == IBM_IDAM",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dmk.cpp"
                                ,0x6f,"bool ReadDMK(MemFile &, std::shared_ptr<Disk> &)");
                }
LAB_0018aa48:
                encoding = local_144;
                if ((byte)local_13c.cyl != 0xfe) {
                  encoding = BitstreamTrackBuilder::encoding((BitstreamTrackBuilder *)local_b0);
                }
                uVar23 = encoding == MFM | 0xfffffff4;
                if ((int)uVar20 < (int)(local_148 + uVar23)) {
                  lVar10 = (long)(int)uVar20;
                  do {
                    TrackBuilder::addByte
                              ((TrackBuilder *)local_b0,
                               (uint)(byte)local_108._M_dataplus._M_p[lVar10]);
                    lVar10 = lVar10 + uVar22;
                  } while (lVar10 < (int)(local_148 + uVar23));
                }
                BitstreamTrackBuilder::setEncoding((BitstreamTrackBuilder *)local_b0,encoding);
                __n_00 = local_b8;
                TrackBuilder::addBlock((TrackBuilder *)local_b0,0,(uint)(encoding == MFM) * 2 + 6);
                TrackBuilder::addAM((TrackBuilder *)local_b0,(uint)(byte)local_13c.cyl,true);
                uVar20 = local_110;
                if (encoding == MFM) {
                  uVar20 = 1;
                }
                uVar22 = (ulong)uVar20;
                uVar20 = local_148 + uVar20;
                local_148 = uVar20;
                if ((byte)local_13c.cyl == 0xfe) {
                  local_12c = local_144;
                  lVar10 = (long)local_114;
                  local_114 = local_114 + 1;
                  local_144 = (0 < (short)local_120[lVar10 + 1]) + MFM;
                  __n = (OPTIONS *)(ulong)local_144;
                  local_134 = 0;
                  uVar23 = (local_120[lVar10 + 1] & 0x3fff) - 0x80;
                  local_130 = uVar21;
                }
                else {
                  __n = (OPTIONS *)CONCAT71((int7)((ulong)__n >> 8),encoding != FM);
                  uVar23 = uVar21;
                  if ((byte)local_13c.cyl == 0xfd && encoding == FM) {
                    BitstreamTrackBuilder::setEncoding((BitstreamTrackBuilder *)local_b0,MFM);
                    uVar22 = 1;
                    uVar12 = (ulong)local_148;
                    goto LAB_0018abcb;
                  }
                }
                uVar12 = (ulong)uVar20;
                uVar21 = uVar23;
              }
LAB_0018abcb:
              uVar23 = (uint)uVar22;
              uVar7 = (uint)uVar12;
            } while ((int)uVar7 < (int)__n_00);
          }
          file = local_c0;
          if ((int)uVar20 < (int)uVar7) {
            lVar10 = (long)(int)uVar20;
            do {
              TrackBuilder::addByte
                        ((TrackBuilder *)local_b0,(uint)(byte)local_108._M_dataplus._M_p[lVar10]);
              lVar10 = lVar10 + (ulong)uVar23;
            } while (lVar10 < (int)local_148);
          }
          this = (local_d8->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          CylHead::CylHead(&local_13c,(int)local_128,local_140);
          __buf = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_b0);
          Disk::write(this,(int)&local_13c,__buf,(size_t)__n);
          uVar4 = local_c8;
          uVar23 = local_cc;
          if (local_60 != (pointer)0x0) {
            operator_delete(local_60,(long)local_50 - (long)local_60);
          }
          if (local_78 != (pointer)0x0) {
            operator_delete(local_78,(long)local_68 - (long)local_78);
          }
          if (local_90 != (pointer)0x0) {
            operator_delete(local_90,(long)local_80 - (long)local_90);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_108._M_dataplus._M_p,
                            local_108.field_2._M_allocated_capacity -
                            (long)local_108._M_dataplus._M_p);
          }
          bVar5 = local_d0 == 0;
          operator_delete(local_120,0x80);
          local_140 = 1;
          unaff_R12 = (pointer)0x0;
        } while ((bVar5 & (byte)uVar4) != 0);
        uVar20 = (int)local_128 + 1;
        local_128 = (ulong)uVar20;
        if (uVar20 == uVar23) {
          pcVar18 = "read-only";
          if ((char)local_e8 == '\0') {
            pcVar18 = "read-write";
          }
          peVar2 = (local_d8->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_b0._0_8_ = local_b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"protect","");
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&peVar2->metadata,(key_type *)local_b0);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,(ulong)pcVar18);
          if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
            operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
          }
          peVar2 = (local_d8->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::_M_replace
                    ((ulong)&peVar2->strType,0,(char *)(peVar2->strType)._M_string_length,0x1b0d6c);
          return true;
        }
      } while( true );
    }
    this_00 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[51]>
              (this_00,(char (*) [51])"DMK ignore density flag is not currently supported");
  }
  __cxa_throw(this_00,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadDMK(MemFile& file, std::shared_ptr<Disk>& disk)
{
    DMK_HEADER dh{};
    if (!file.rewind() || !file.read(&dh, sizeof(dh)))
        return false;
    else if ((dh.protect != 0x00 && dh.protect != 0xff))
        return false;

    bool ignore_density = (dh.flags & 0x80) != 0;
    bool single_density = (dh.flags & 0x40) != 0;
    bool single_sided = (dh.flags & 0x10) != 0;

    if (util::letoh(dh.realsig) == 0x12345678)
        throw util::exception("DMK real-disk-specification images contain no data");

    auto cyls = dh.cyls;
    auto heads = single_sided ? 1 : 2;
    int tracklen = util::letoh(dh.tracklen);
    if (!cyls || !tracklen || tracklen > DMK_MAX_TRACK_LENGTH)
        return false;

    auto total_size = static_cast<int>(sizeof(DMK_HEADER) + tracklen * cyls * heads);
    if (file.size() != total_size)
    {
        // Accept wrong size only if the extension is recognised.
        if (!IsFileExt(file.name(), "dmk") && !IsFileExt(file.name(), "dsk"))
            return false;

        Message(msgWarning, "DMK size (%d) doesn't match calculated size (%d)",
            file.size(), total_size);
    }

    if (ignore_density)
        throw util::exception("DMK ignore density flag is not currently supported");

    tracklen -= DMK_TRACK_INDEX_SIZE;

    for (auto cyl = 0; cyl < cyls; ++cyl)
    {
        for (auto head = 0; head < heads; ++head)
        {
            std::vector<uint16_t> index(64);
            std::vector<uint8_t> data(tracklen);

            if (!file.read(index) || !file.read(data))
                Message(msgWarning, "short file reading %s", CH(cyl, head));

            std::transform(index.begin(), index.end(), index.begin(),
                [](uint16_t w) { return util::letoh(w); });

            int idx_idam = 0;
            int pos = 0;
            int last_pos = pos;

            int current_idam_pos = 0;
            int next_idam_pos = (index[0] & 0x3fff) - DMK_TRACK_INDEX_SIZE;

            auto next_idam_encoding =
                (!index[0] || (index[0] & 0x8000)) ? Encoding::MFM : Encoding::FM;
            auto current_idam_encoding = next_idam_encoding;

            int fm_step = single_density ? 1 : 2;
            int step = (current_idam_encoding == Encoding::MFM) ? 1 : fm_step;

            bool found_iam = false;
            bool found_dam = false;

            BitstreamTrackBuilder bitbuf(DataRate::_250K, current_idam_encoding);
            if (opt.debug)
                util::cout << "DMK: " << CylHead(cyl, head) << "\n";

            while (pos < tracklen)
            {
                auto b = data[pos];
                bool is_am = false;

                if (next_idam_pos > 0 && pos >= next_idam_pos)
                {
                    // Force sync in case of odd/even mismatch.
                    pos = next_idam_pos;
                    b = data[pos];

                    if (opt.debug)
                    {
                        util::cout << next_idam_encoding << " IDAM (" <<
                            data[pos + 3 * ((next_idam_encoding == Encoding::MFM) ? 1 : fm_step)] <<
                            ") at offset " << pos << "\n";
                    }

                    assert(b == IBM_IDAM);
                    is_am = true;
                }
                else if (!found_iam && b == IBM_IAM && current_idam_pos == 0)
                {
                    if (opt.debug)
                        util::cout << next_idam_encoding << " IAM at offset " << pos << "\n";

                    is_am = found_iam = true;
                }
                else if (!found_dam && b >= 0xf8 && b <= 0xfd)
                {
                    auto min_distance = ((current_idam_encoding == Encoding::MFM) ? 14 : 7) * step;
                    auto max_distance = min_distance + ((current_idam_encoding == Encoding::MFM) ? 43 : 30) * step;
                    auto idam_distance = current_idam_pos ? (pos - current_idam_pos) : 0;

                    if (idam_distance >= min_distance && idam_distance <= max_distance)
                    {
                        if (opt.debug)
                            util::cout << current_idam_encoding << " DAM (" << b << ") at offset " << pos << "\n";

                        is_am = found_dam = true;
                    }
                }

                if (is_am)
                {
                    auto am_encoding = (b == IBM_IDAM) ? next_idam_encoding : bitbuf.encoding();
                    int rewind = (am_encoding == Encoding::MFM) ? (8 + 3) : (6 * 2);

                    while (last_pos < (pos - rewind))
                    {
                        bitbuf.addByte(data[last_pos]);
                        last_pos += step;
                    }

                    // Rewrite minimal sync and the address mark with missing clock bits
                    bitbuf.setEncoding(am_encoding);
                    bitbuf.addBlock(0x00, (am_encoding == Encoding::MFM) ? 8 : 6);
                    bitbuf.addAM(b, true);

                    step = (am_encoding == Encoding::MFM) ? 1 : fm_step;
                    pos += step;
                    last_pos = pos;

                    if (b == IBM_IDAM)
                    {
                        current_idam_pos = next_idam_pos;
                        current_idam_encoding = next_idam_encoding;
                        found_dam = false;

                        auto idam_entry = index[++idx_idam];
                        next_idam_pos = (idam_entry & 0x3fff) - 0x80;
                        next_idam_encoding = (!idam_entry || (idam_entry & 0x8000)) ? Encoding::MFM : Encoding::FM;
                    }
                    else if (am_encoding == Encoding::FM && b == IBM_DAM_RX02)
                    {
                        bitbuf.setEncoding(Encoding::MFM);
                        step = 1;
                    }

                    continue;
                }

                pos += step;
            }

            while (last_pos < pos)
            {
                bitbuf.addByte(data[last_pos]);
                last_pos += step;
            }

            disk->write(CylHead(cyl, head), std::move(bitbuf.buffer()));
        }
    }

    disk->metadata["protect"] = dh.protect ? "read-only" : "read-write";

    disk->strType = "DMK";
    return true;
}